

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::Init(idx2_file *Idx2,params *P)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  u64 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined8 in_RCX;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar8;
  stref Dir;
  idx2_file *local_1a0;
  undefined2 local_198;
  bool bStack_196;
  anon_class_1_0_00000001 local_189 [21];
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined8 local_168;
  int local_160;
  undefined8 local_154;
  int local_14c;
  idx2_file *local_148;
  undefined2 local_140;
  bool bStack_13e;
  anon_class_8_1_32d6a57b local_138;
  error<idx2::idx2_err_code> local_130;
  undefined1 local_120 [8];
  error<idx2::idx2_err_code> Result_1;
  undefined2 local_108;
  bool bStack_106;
  anon_class_8_1_32d6a57b local_100;
  error<idx2::idx2_err_code> local_f8;
  undefined1 local_e8 [8];
  error<idx2::idx2_err_code> Result;
  params *P_local;
  idx2_file *Idx2_local;
  undefined2 local_b0;
  undefined1 uStack_ae;
  undefined5 uStack_ad;
  undefined8 local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  v3i *local_10;
  
  Result._8_8_ = (P->InDir).field_0.Ptr;
  Dir.field_0.Ptr = (str)(*(ulong *)&(P->InDir).Size & 0xffffffff);
  Dir._8_8_ = in_RCX;
  SetDir((idx2 *)Idx2,(idx2_file *)Result._8_8_,Dir);
  SetDownsamplingFactor(Idx2,&P->DownsamplingFactor3);
  lVar4 = *in_FS_OFFSET;
  snprintf((char *)(lVar4 + -0xf80),0x400,"%s",P->InputFile);
  eVar8 = ReadMetaFile(Idx2,(char *)(lVar4 + -0xf80));
  local_f8.Msg = eVar8.Msg;
  local_e8 = (undefined1  [8])local_f8.Msg;
  local_f8._8_2_ = eVar8._8_2_;
  Result.Msg._0_1_ = local_f8.Code;
  Result.Msg._1_1_ = local_f8.StackIdx;
  local_f8.StrGened = eVar8.StrGened;
  Result.Msg._2_1_ = local_f8.StrGened;
  local_f8 = eVar8;
  bVar7 = error::operator_cast_to_bool((error *)local_e8);
  if (bVar7) {
    eVar8 = Finalize(Idx2,P);
    local_130.Msg = eVar8.Msg;
    local_120 = (undefined1  [8])local_130.Msg;
    local_130._8_2_ = eVar8._8_2_;
    Result_1.Msg._0_1_ = local_130.Code;
    Result_1.Msg._1_1_ = local_130.StackIdx;
    local_130.StrGened = eVar8.StrGened;
    Result_1.Msg._2_1_ = local_130.StrGened;
    local_130 = eVar8;
    bVar7 = error::operator_cast_to_bool((error *)local_120);
    if (bVar7) {
      uVar5 = (P->DecodeExtent).Dims;
      local_1c = ((int)uVar5 << 0xb) >> 0xb;
      local_18 = &local_30;
      local_20 = (int)((long)(uVar5 << 0x16) >> 0x2b);
      local_160 = (int)((long)(uVar5 * 2) >> 0x2b);
      local_30._0_4_ = local_1c;
      local_30._4_4_ = local_20;
      local_168 = local_30;
      local_154 = local_30;
      uVar6 = local_154;
      local_174 = 0;
      local_170 = 0;
      local_16c = 0;
      local_154._0_4_ = (int)local_30;
      bVar7 = false;
      if ((int)local_154 == 0) {
        local_154._4_4_ = (int)((ulong)local_30 >> 0x20);
        bVar7 = false;
        if (local_154._4_4_ == 0) {
          bVar7 = local_160 == 0;
        }
      }
      if (bVar7) {
        local_10 = &Idx2->Dims3;
        uVar1 = (local_10->field_0).field_0.X;
        uVar2 = (Idx2->Dims3).field_0.field_0.Y;
        uVar3 = (Idx2->Dims3).field_0.field_0.Z;
        (P->DecodeExtent).From = 0;
        (P->DecodeExtent).Dims =
             (long)(int)(uVar1 & 0x1fffff) + (long)(int)(uVar2 & 0x1fffff) * 0x200000 +
             ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
      }
      local_154 = uVar6;
      local_14c = local_160;
      local_24 = local_160;
      eVar8 = Init::anon_class_1_0_00000001::operator()(local_189);
      local_1a0 = (idx2_file *)eVar8.Msg;
      Idx2_local = local_1a0;
      local_198 = eVar8._8_2_;
      local_b0 = local_198;
      bStack_196 = eVar8.StrGened;
      uStack_ae = bStack_196;
    }
    else {
      local_138.Result = (error<idx2::idx2_err_code> *)local_120;
      eVar8 = Init::anon_class_8_1_32d6a57b::operator()(&local_138);
      local_148 = (idx2_file *)eVar8.Msg;
      Idx2_local = local_148;
      local_140 = eVar8._8_2_;
      local_b0 = local_140;
      bStack_13e = eVar8.StrGened;
      uStack_ae = bStack_13e;
    }
  }
  else {
    local_100.Result = (error<idx2::idx2_err_code> *)local_e8;
    eVar8 = Init::anon_class_8_1_32d6a57b::operator()(&local_100);
    Result_1._8_8_ = eVar8.Msg;
    Idx2_local = (idx2_file *)Result_1._8_8_;
    local_108 = eVar8._8_2_;
    local_b0 = local_108;
    bStack_106 = eVar8.StrGened;
    uStack_ae = bStack_106;
  }
  eVar8.Code = (undefined1)local_b0;
  eVar8.StackIdx = local_b0._1_1_;
  eVar8.Msg = Idx2_local->Name;
  eVar8.StrGened = (bool)uStack_ae;
  eVar8._11_5_ = uStack_ad;
  return eVar8;
}

Assistant:

error<idx2_err_code>
Init(idx2_file* Idx2, params& P)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFile(Idx2, idx2_PrintScratch("%s", P.InputFile)));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}